

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackExternalGenerator::cmCPackExternalVersionGenerator::WriteToJSON
          (cmCPackExternalVersionGenerator *this,Value *root)

{
  cmCPackExternalGenerator *pcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  cmValue cVar6;
  Value *pVVar7;
  string *psVar8;
  Value *pVVar9;
  Value *pVVar10;
  _Base_ptr p_Var11;
  char *extraout_RDX;
  cmCPackInstallationType **installationType;
  pointer ppcVar12;
  pointer ppcVar13;
  _Base_ptr p_Var14;
  _Rb_tree_header *p_Var15;
  cmCPackComponent **dep;
  pointer value;
  cmCPackInstallationType **installationType_1;
  string_view value_00;
  string_view value_01;
  Value jsonProject;
  ValueHolder local_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  ValueHolder local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pointer local_50;
  Value *local_48;
  cmCPackExternalVersionGenerator *local_40;
  Value *local_38;
  
  WriteVersion(this,root);
  pcVar1 = this->Parent;
  local_a0[0].string_ = (char *)&local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"CPACK_PACKAGE_NAME","");
  cVar6 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)local_a0);
  if (local_a0[0] != &local_90) {
    operator_delete(local_a0[0].string_,local_90._M_allocated_capacity + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    Json::Value::Value((Value *)local_a0,cVar6.Value);
    pVVar7 = Json::Value::operator[](root,"packageName");
    Json::Value::operator=(pVVar7,(Value *)local_a0);
    Json::Value::~Value((Value *)local_a0);
  }
  pcVar1 = this->Parent;
  local_a0[0].string_ = (char *)&local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"CPACK_PACKAGE_VERSION","");
  cVar6 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)local_a0);
  if (local_a0[0] != &local_90) {
    operator_delete(local_a0[0].string_,local_90._M_allocated_capacity + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    Json::Value::Value((Value *)local_a0,cVar6.Value);
    pVVar7 = Json::Value::operator[](root,"packageVersion");
    Json::Value::operator=(pVVar7,(Value *)local_a0);
    Json::Value::~Value((Value *)local_a0);
  }
  pcVar1 = this->Parent;
  local_a0[0].string_ = (char *)&local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"CPACK_PACKAGE_DESCRIPTION_FILE","");
  cVar6 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)local_a0);
  if (local_a0[0] != &local_90) {
    operator_delete(local_a0[0].string_,local_90._M_allocated_capacity + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    Json::Value::Value((Value *)local_a0,cVar6.Value);
    pVVar7 = Json::Value::operator[](root,"packageDescriptionFile");
    Json::Value::operator=(pVVar7,(Value *)local_a0);
    Json::Value::~Value((Value *)local_a0);
  }
  pcVar1 = this->Parent;
  local_a0[0].string_ = (char *)&local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"CPACK_PACKAGE_DESCRIPTION_SUMMARY","");
  cVar6 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)local_a0);
  if (local_a0[0] != &local_90) {
    operator_delete(local_a0[0].string_,local_90._M_allocated_capacity + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    Json::Value::Value((Value *)local_a0,cVar6.Value);
    pVVar7 = Json::Value::operator[](root,"packageDescriptionSummary");
    Json::Value::operator=(pVVar7,(Value *)local_a0);
    Json::Value::~Value((Value *)local_a0);
  }
  pcVar1 = this->Parent;
  local_a0[0].string_ = (char *)&local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"CPACK_BUILD_CONFIG","");
  cVar6 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)local_a0);
  if (local_a0[0] != &local_90) {
    operator_delete(local_a0[0].string_,local_90._M_allocated_capacity + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    Json::Value::Value((Value *)local_a0,cVar6.Value);
    pVVar7 = Json::Value::operator[](root,"buildConfig");
    Json::Value::operator=(pVVar7,(Value *)local_a0);
    Json::Value::~Value((Value *)local_a0);
  }
  pcVar1 = this->Parent;
  local_a0[0].string_ = (char *)&local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS","");
  psVar8 = (string *)cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)local_a0)
  ;
  if (local_a0[0] != &local_90) {
    operator_delete(local_a0[0].string_,local_90._M_allocated_capacity + 1);
  }
  if ((psVar8 != (string *)0x0) && (psVar8->_M_string_length != 0)) {
    if (psVar8 == (string *)0x0) {
      psVar8 = &cmValue::Empty_abi_cxx11_;
    }
    Json::Value::Value((Value *)local_a0,psVar8);
    pVVar7 = Json::Value::operator[](root,"defaultDirectoryPermissions");
    Json::Value::operator=(pVVar7,(Value *)local_a0);
    Json::Value::~Value((Value *)local_a0);
  }
  pcVar1 = this->Parent;
  local_a0[0].string_ = (char *)&local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"CPACK_SET_DESTDIR","");
  cVar6 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)local_a0);
  if (cVar6.Value == (string *)0x0) {
    bVar5 = false;
  }
  else {
    value_00._M_str = extraout_RDX;
    value_00._M_len = (size_t)((cVar6.Value)->_M_dataplus)._M_p;
    bVar5 = cmValue::IsInternallyOn((cmValue *)(cVar6.Value)->_M_string_length,value_00);
  }
  if (local_a0[0] != &local_90) {
    operator_delete(local_a0[0].string_,local_90._M_allocated_capacity + 1);
  }
  if (bVar5 == false) {
    Json::Value::Value((Value *)local_a0,false);
    pVVar7 = Json::Value::operator[](root,"setDestdir");
    Json::Value::operator=(pVVar7,(Value *)local_a0);
    Json::Value::~Value((Value *)local_a0);
  }
  else {
    Json::Value::Value((Value *)local_a0,true);
    pVVar7 = Json::Value::operator[](root,"setDestdir");
    Json::Value::operator=(pVVar7,(Value *)local_a0);
    Json::Value::~Value((Value *)local_a0);
    pcVar1 = this->Parent;
    local_78[0].string_ = (char *)&local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"CPACK_PACKAGING_INSTALL_PREFIX","");
    psVar8 = (string *)
             cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)local_78);
    if (psVar8 == (string *)0x0) {
      psVar8 = &cmValue::Empty_abi_cxx11_;
    }
    Json::Value::Value((Value *)local_a0,psVar8);
    pVVar7 = Json::Value::operator[](root,"packagingInstallPrefix");
    Json::Value::operator=(pVVar7,(Value *)local_a0);
    Json::Value::~Value((Value *)local_a0);
    if (local_78[0] != &local_68) {
      operator_delete(local_78[0].string_,local_68._M_allocated_capacity + 1);
    }
  }
  pcVar1 = this->Parent;
  local_78[0].string_ = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"CPACK_STRIP_FILES","");
  cVar6 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)local_78);
  if (cVar6.Value == (string *)0x0) {
    bVar5 = false;
  }
  else {
    value_01._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
    value_01._M_len = (cVar6.Value)->_M_string_length;
    bVar5 = cmValue::IsOff(value_01);
    bVar5 = !bVar5;
  }
  Json::Value::Value((Value *)local_a0,bVar5);
  pVVar7 = Json::Value::operator[](root,"stripFiles");
  Json::Value::operator=(pVVar7,(Value *)local_a0);
  Json::Value::~Value((Value *)local_a0);
  if (local_78[0] != &local_68) {
    operator_delete(local_78[0].string_,local_68._M_allocated_capacity + 1);
  }
  pcVar1 = this->Parent;
  local_78[0].string_ = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION","");
  bVar5 = cmCPackGenerator::IsOn(&pcVar1->super_cmCPackGenerator,(string *)local_78);
  Json::Value::Value((Value *)local_a0,bVar5);
  pVVar7 = Json::Value::operator[](root,"warnOnAbsoluteInstallDestination");
  Json::Value::operator=(pVVar7,(Value *)local_a0);
  Json::Value::~Value((Value *)local_a0);
  if (local_78[0] != &local_68) {
    operator_delete(local_78[0].string_,local_68._M_allocated_capacity + 1);
  }
  pcVar1 = this->Parent;
  local_78[0].string_ = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION","");
  bVar5 = cmCPackGenerator::IsOn(&pcVar1->super_cmCPackGenerator,(string *)local_78);
  Json::Value::Value((Value *)local_a0,bVar5);
  pVVar7 = Json::Value::operator[](root,"errorOnAbsoluteInstallDestination");
  Json::Value::operator=(pVVar7,(Value *)local_a0);
  Json::Value::~Value((Value *)local_a0);
  if (local_78[0] != &local_68) {
    operator_delete(local_78[0].string_,local_68._M_allocated_capacity + 1);
  }
  Json::Value::Value((Value *)local_a0,arrayValue);
  local_38 = root;
  pVVar7 = Json::Value::operator[](root,"projects");
  local_48 = Json::Value::operator=(pVVar7,(Value *)local_a0);
  Json::Value::~Value((Value *)local_a0);
  value = (this->Parent->super_cmCPackGenerator).CMakeProjects.
          super__Vector_base<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (this->Parent->super_cmCPackGenerator).CMakeProjects.
             super__Vector_base<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = this;
  if (value != local_50) {
    do {
      Json::Value::Value((Value *)local_a0,objectValue);
      Json::Value::Value((Value *)local_78,&value->ProjectName);
      pVVar7 = Json::Value::operator[]((Value *)local_a0,"projectName");
      Json::Value::operator=(pVVar7,(Value *)local_78);
      Json::Value::~Value((Value *)local_78);
      Json::Value::Value((Value *)local_78,&value->Component);
      pVVar7 = Json::Value::operator[]((Value *)local_a0,"component");
      Json::Value::operator=(pVVar7,(Value *)local_78);
      Json::Value::~Value((Value *)local_78);
      Json::Value::Value((Value *)local_78,&value->Directory);
      pVVar7 = Json::Value::operator[]((Value *)local_a0,"directory");
      Json::Value::operator=(pVVar7,(Value *)local_78);
      Json::Value::~Value((Value *)local_78);
      Json::Value::Value((Value *)local_78,&value->SubDirectory);
      pVVar7 = Json::Value::operator[]((Value *)local_a0,"subDirectory");
      Json::Value::operator=(pVVar7,(Value *)local_78);
      Json::Value::~Value((Value *)local_78);
      Json::Value::Value((Value *)local_78,arrayValue);
      pVVar7 = Json::Value::operator[]((Value *)local_a0,"installationTypes");
      pVVar7 = Json::Value::operator=(pVVar7,(Value *)local_78);
      Json::Value::~Value((Value *)local_78);
      ppcVar2 = (value->InstallationTypes).
                super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar12 = (value->InstallationTypes).
                      super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppcVar12 != ppcVar2;
          ppcVar12 = ppcVar12 + 1) {
        Json::Value::Value((Value *)local_78,&(*ppcVar12)->Name);
        Json::Value::append(pVVar7,(Value *)local_78);
        Json::Value::~Value((Value *)local_78);
      }
      Json::Value::Value((Value *)local_78,arrayValue);
      pVVar7 = Json::Value::operator[]((Value *)local_a0,"components");
      pVVar7 = Json::Value::operator=(pVVar7,(Value *)local_78);
      Json::Value::~Value((Value *)local_78);
      ppcVar3 = (value->Components).
                super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppcVar13 = (value->Components).
                      super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppcVar13 != ppcVar3;
          ppcVar13 = ppcVar13 + 1) {
        Json::Value::Value((Value *)local_78,&(*ppcVar13)->Name);
        Json::Value::append(pVVar7,(Value *)local_78);
        Json::Value::~Value((Value *)local_78);
      }
      Json::Value::append(local_48,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      value = value + 1;
    } while (value != local_50);
  }
  Json::Value::Value((Value *)local_a0,objectValue);
  pVVar7 = Json::Value::operator[](local_38,"installationTypes");
  pVVar7 = Json::Value::operator=(pVVar7,(Value *)local_a0);
  Json::Value::~Value((Value *)local_a0);
  p_Var11 = (local_40->Parent->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
            super__Rb_tree_header._M_header._M_left;
  p_Var15 = &(local_40->Parent->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
             super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var15) {
    do {
      Json::Value::Value((Value *)local_a0,objectValue);
      pVVar9 = Json::Value::operator[](pVVar7,(String *)(p_Var11 + 1));
      pVVar9 = Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(String *)(p_Var11 + 2));
      pVVar10 = Json::Value::operator[](pVVar9,"name");
      Json::Value::operator=(pVVar10,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(String *)(p_Var11 + 3));
      pVVar10 = Json::Value::operator[](pVVar9,"displayName");
      Json::Value::operator=(pVVar10,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,p_Var11[4]._M_color);
      pVVar9 = Json::Value::operator[](pVVar9,"index");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var15);
  }
  Json::Value::Value((Value *)local_a0,objectValue);
  pVVar7 = Json::Value::operator[](local_38,"components");
  local_48 = Json::Value::operator=(pVVar7,(Value *)local_a0);
  Json::Value::~Value((Value *)local_a0);
  p_Var11 = (local_40->Parent->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header
            ._M_header._M_left;
  local_50 = (pointer)&(local_40->Parent->super_cmCPackGenerator).Components._M_t._M_impl.
                       super__Rb_tree_header;
  if ((pointer)p_Var11 != local_50) {
    do {
      Json::Value::Value((Value *)local_a0,objectValue);
      pVVar7 = Json::Value::operator[](local_48,(String *)(p_Var11 + 1));
      pVVar7 = Json::Value::operator=(pVVar7,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(String *)(p_Var11 + 2));
      pVVar9 = Json::Value::operator[](pVVar7,"name");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(String *)(p_Var11 + 3));
      pVVar9 = Json::Value::operator[](pVVar7,"displayName");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      if (*(String **)(p_Var11 + 4) != (String *)0x0) {
        Json::Value::Value((Value *)local_a0,*(String **)(p_Var11 + 4));
        pVVar9 = Json::Value::operator[](pVVar7,"group");
        Json::Value::operator=(pVVar9,(Value *)local_a0);
        Json::Value::~Value((Value *)local_a0);
      }
      Json::Value::Value((Value *)local_a0,(bool)(*(byte *)&p_Var11[4]._M_parent & 1));
      pVVar9 = Json::Value::operator[](pVVar7,"isRequired");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(bool)((*(byte *)&p_Var11[4]._M_parent & 2) >> 1));
      pVVar9 = Json::Value::operator[](pVVar7,"isHidden");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(bool)((*(byte *)&p_Var11[4]._M_parent & 4) >> 2));
      pVVar9 = Json::Value::operator[](pVVar7,"isDisabledByDefault");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(bool)((*(byte *)&p_Var11[4]._M_parent & 8) >> 3));
      pVVar9 = Json::Value::operator[](pVVar7,"isDownloaded");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(String *)&p_Var11[4]._M_left);
      pVVar9 = Json::Value::operator[](pVVar7,"description");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(String *)&p_Var11[6]._M_parent);
      pVVar9 = Json::Value::operator[](pVVar7,"archiveFile");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,arrayValue);
      pVVar9 = Json::Value::operator[](pVVar7,"installationTypes");
      pVVar9 = Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      p_Var4 = p_Var11[5]._M_right;
      for (p_Var14 = p_Var11[5]._M_left; p_Var14 != p_Var4; p_Var14 = (_Base_ptr)&p_Var14->_M_parent
          ) {
        Json::Value::Value((Value *)local_a0,*(String **)p_Var14);
        Json::Value::append(pVVar9,(Value *)local_a0);
        Json::Value::~Value((Value *)local_a0);
      }
      Json::Value::Value((Value *)local_a0,arrayValue);
      pVVar7 = Json::Value::operator[](pVVar7,"dependencies");
      pVVar7 = Json::Value::operator=(pVVar7,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      p_Var4 = p_Var11[8]._M_left;
      for (p_Var14 = p_Var11[8]._M_parent; p_Var14 != p_Var4;
          p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
        Json::Value::Value((Value *)local_a0,*(String **)p_Var14);
        Json::Value::append(pVVar7,(Value *)local_a0);
        Json::Value::~Value((Value *)local_a0);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((pointer)p_Var11 != local_50);
  }
  Json::Value::Value((Value *)local_a0,objectValue);
  pVVar7 = Json::Value::operator[](local_38,"componentGroups");
  local_48 = Json::Value::operator=(pVVar7,(Value *)local_a0);
  Json::Value::~Value((Value *)local_a0);
  p_Var11 = (local_40->Parent->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
            super__Rb_tree_header._M_header._M_left;
  local_50 = (pointer)&(local_40->Parent->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                       super__Rb_tree_header;
  if ((pointer)p_Var11 != local_50) {
    do {
      Json::Value::Value((Value *)local_a0,objectValue);
      pVVar7 = Json::Value::operator[](local_48,(String *)(p_Var11 + 1));
      pVVar7 = Json::Value::operator=(pVVar7,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(String *)(p_Var11 + 2));
      pVVar9 = Json::Value::operator[](pVVar7,"name");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(String *)(p_Var11 + 3));
      pVVar9 = Json::Value::operator[](pVVar7,"displayName");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(String *)(p_Var11 + 4));
      pVVar9 = Json::Value::operator[](pVVar7,"description");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(bool)((char)p_Var11[5]._M_color & _S_black));
      pVVar9 = Json::Value::operator[](pVVar7,"isBold");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      Json::Value::Value((Value *)local_a0,(bool)((byte)((char)p_Var11[5]._M_color & 2) >> 1));
      pVVar9 = Json::Value::operator[](pVVar7,"isExpandedByDefault");
      Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      if (*(String **)(p_Var11 + 6) != (String *)0x0) {
        Json::Value::Value((Value *)local_a0,*(String **)(p_Var11 + 6));
        pVVar9 = Json::Value::operator[](pVVar7,"parentGroup");
        Json::Value::operator=(pVVar9,(Value *)local_a0);
        Json::Value::~Value((Value *)local_a0);
      }
      Json::Value::Value((Value *)local_a0,arrayValue);
      pVVar9 = Json::Value::operator[](pVVar7,"subgroups");
      pVVar9 = Json::Value::operator=(pVVar9,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      p_Var4 = p_Var11[6]._M_left;
      for (p_Var14 = p_Var11[6]._M_parent; p_Var14 != p_Var4;
          p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
        Json::Value::Value((Value *)local_a0,*(String **)p_Var14);
        Json::Value::append(pVVar9,(Value *)local_a0);
        Json::Value::~Value((Value *)local_a0);
      }
      Json::Value::Value((Value *)local_a0,arrayValue);
      pVVar7 = Json::Value::operator[](pVVar7,"components");
      pVVar7 = Json::Value::operator=(pVVar7,(Value *)local_a0);
      Json::Value::~Value((Value *)local_a0);
      p_Var4 = p_Var11[5]._M_left;
      for (p_Var14 = p_Var11[5]._M_parent; p_Var14 != p_Var4;
          p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
        Json::Value::Value((Value *)local_a0,*(String **)p_Var14);
        Json::Value::append(pVVar7,(Value *)local_a0);
        Json::Value::~Value((Value *)local_a0);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((pointer)p_Var11 != local_50);
  }
  return 1;
}

Assistant:

int cmCPackExternalGenerator::cmCPackExternalVersionGenerator::WriteToJSON(
  Json::Value& root)
{
  if (!this->WriteVersion(root)) {
    return 0;
  }

  cmValue packageName = this->Parent->GetOption("CPACK_PACKAGE_NAME");
  if (packageName) {
    root["packageName"] = *packageName;
  }

  cmValue packageVersion = this->Parent->GetOption("CPACK_PACKAGE_VERSION");
  if (packageVersion) {
    root["packageVersion"] = *packageVersion;
  }

  cmValue packageDescriptionFile =
    this->Parent->GetOption("CPACK_PACKAGE_DESCRIPTION_FILE");
  if (packageDescriptionFile) {
    root["packageDescriptionFile"] = *packageDescriptionFile;
  }

  cmValue packageDescriptionSummary =
    this->Parent->GetOption("CPACK_PACKAGE_DESCRIPTION_SUMMARY");
  if (packageDescriptionSummary) {
    root["packageDescriptionSummary"] = *packageDescriptionSummary;
  }

  cmValue buildConfigCstr = this->Parent->GetOption("CPACK_BUILD_CONFIG");
  if (buildConfigCstr) {
    root["buildConfig"] = *buildConfigCstr;
  }

  cmValue defaultDirectoryPermissions =
    this->Parent->GetOption("CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (cmNonempty(defaultDirectoryPermissions)) {
    root["defaultDirectoryPermissions"] = *defaultDirectoryPermissions;
  }
  if (cmIsInternallyOn(this->Parent->GetOption("CPACK_SET_DESTDIR"))) {
    root["setDestdir"] = true;
    root["packagingInstallPrefix"] =
      *this->Parent->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
  } else {
    root["setDestdir"] = false;
  }

  root["stripFiles"] = !cmIsOff(this->Parent->GetOption("CPACK_STRIP_FILES"));
  root["warnOnAbsoluteInstallDestination"] =
    this->Parent->IsOn("CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION");
  root["errorOnAbsoluteInstallDestination"] =
    this->Parent->IsOn("CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION");

  Json::Value& projects = root["projects"] = Json::Value(Json::arrayValue);
  for (auto& project : this->Parent->CMakeProjects) {
    Json::Value jsonProject(Json::objectValue);

    jsonProject["projectName"] = project.ProjectName;
    jsonProject["component"] = project.Component;
    jsonProject["directory"] = project.Directory;
    jsonProject["subDirectory"] = project.SubDirectory;

    Json::Value& installationTypes = jsonProject["installationTypes"] =
      Json::Value(Json::arrayValue);
    for (auto& installationType : project.InstallationTypes) {
      installationTypes.append(installationType->Name);
    }

    Json::Value& components = jsonProject["components"] =
      Json::Value(Json::arrayValue);
    for (auto& component : project.Components) {
      components.append(component->Name);
    }

    projects.append(jsonProject);
  }

  Json::Value& installationTypes = root["installationTypes"] =
    Json::Value(Json::objectValue);
  for (auto& installationType : this->Parent->InstallationTypes) {
    Json::Value& jsonInstallationType =
      installationTypes[installationType.first] =
        Json::Value(Json::objectValue);

    jsonInstallationType["name"] = installationType.second.Name;
    jsonInstallationType["displayName"] = installationType.second.DisplayName;
    jsonInstallationType["index"] = installationType.second.Index;
  }

  Json::Value& components = root["components"] =
    Json::Value(Json::objectValue);
  for (auto& component : this->Parent->Components) {
    Json::Value& jsonComponent = components[component.first] =
      Json::Value(Json::objectValue);

    jsonComponent["name"] = component.second.Name;
    jsonComponent["displayName"] = component.second.DisplayName;
    if (component.second.Group) {
      jsonComponent["group"] = component.second.Group->Name;
    }
    jsonComponent["isRequired"] = component.second.IsRequired;
    jsonComponent["isHidden"] = component.second.IsHidden;
    jsonComponent["isDisabledByDefault"] =
      component.second.IsDisabledByDefault;
    jsonComponent["isDownloaded"] = component.second.IsDownloaded;
    jsonComponent["description"] = component.second.Description;
    jsonComponent["archiveFile"] = component.second.ArchiveFile;

    Json::Value& cmpInstallationTypes = jsonComponent["installationTypes"] =
      Json::Value(Json::arrayValue);
    for (auto& installationType : component.second.InstallationTypes) {
      cmpInstallationTypes.append(installationType->Name);
    }

    Json::Value& dependencies = jsonComponent["dependencies"] =
      Json::Value(Json::arrayValue);
    for (auto& dep : component.second.Dependencies) {
      dependencies.append(dep->Name);
    }
  }

  Json::Value& groups = root["componentGroups"] =
    Json::Value(Json::objectValue);
  for (auto& group : this->Parent->ComponentGroups) {
    Json::Value& jsonGroup = groups[group.first] =
      Json::Value(Json::objectValue);

    jsonGroup["name"] = group.second.Name;
    jsonGroup["displayName"] = group.second.DisplayName;
    jsonGroup["description"] = group.second.Description;
    jsonGroup["isBold"] = group.second.IsBold;
    jsonGroup["isExpandedByDefault"] = group.second.IsExpandedByDefault;
    if (group.second.ParentGroup) {
      jsonGroup["parentGroup"] = group.second.ParentGroup->Name;
    }

    Json::Value& subgroups = jsonGroup["subgroups"] =
      Json::Value(Json::arrayValue);
    for (auto& subgroup : group.second.Subgroups) {
      subgroups.append(subgroup->Name);
    }

    Json::Value& groupComponents = jsonGroup["components"] =
      Json::Value(Json::arrayValue);
    for (auto& component : group.second.Components) {
      groupComponents.append(component->Name);
    }
  }

  return 1;
}